

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_code(void)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *str;
  bson_t scope;
  bson_t code;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined1 local_1f8;
  undefined4 local_180;
  undefined4 local_17c;
  undefined1 local_178;
  
  memset(&local_180,0,0x80);
  local_180 = 3;
  local_17c = 5;
  local_178 = 5;
  memset(&local_200,0,0x80);
  local_200 = 3;
  local_1fc = 5;
  local_1f8 = 5;
  bVar1 = bson_append_code(&local_180,"c",0xffffffff,"function () {}");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x1cc,"test_bson_as_json_code","bson_append_code (&code, \"c\", -1, \"function () {}\")"
           );
    abort();
  }
  pcVar3 = (char *)bson_as_json(&local_180,0);
  if (pcVar3 != "{ \"c\" : { \"$code\" : \"function () {}\" } }") {
    iVar2 = strcmp(pcVar3,"{ \"c\" : { \"$code\" : \"function () {}\" } }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar3,
              "{ \"c\" : { \"$code\" : \"function () {}\" } }");
      abort();
    }
  }
  bson_free(pcVar3);
  bson_reinit(&local_180);
  bVar1 = bson_append_code_with_scope(&local_180,"c",1,"function () {}",&local_200);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x1d5,"test_bson_as_json_code",
            "BSON_APPEND_CODE_WITH_SCOPE (&code, \"c\", \"function () {}\", &scope)");
    abort();
  }
  pcVar3 = (char *)bson_as_json(&local_180,0);
  if (pcVar3 != "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }") {
    iVar2 = strcmp(pcVar3,"{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar3,
              "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");
      abort();
    }
  }
  bson_free(pcVar3);
  bson_reinit(&local_180);
  bson_append_int32(&local_200,"x",1);
  bVar1 = bson_append_code_with_scope(&local_180,"c",1,"function () {}",&local_200);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x1df,"test_bson_as_json_code",
            "BSON_APPEND_CODE_WITH_SCOPE (&code, \"c\", \"function () {}\", &scope)");
    abort();
  }
  pcVar3 = (char *)bson_as_json(&local_180,0);
  if (pcVar3 != "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }") {
    iVar2 = strcmp(pcVar3,
                   "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar3,
              "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { \"x\" : 1 } } }");
      abort();
    }
  }
  bson_free(pcVar3);
  bson_reinit(&local_180);
  bVar1 = bson_append_code(&local_180,"c",1,"return \"a\"");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x1e9,"test_bson_as_json_code","BSON_APPEND_CODE (&code, \"c\", \"return \\\"a\\\"\")");
    abort();
  }
  pcVar3 = (char *)bson_as_json(&local_180,0);
  if (pcVar3 != "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }") {
    iVar2 = strcmp(pcVar3,"{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar3,
              "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");
      abort();
    }
  }
  bson_free(pcVar3);
  bson_destroy(&local_180);
  bson_destroy(&local_200);
  return;
}

Assistant:

static void
test_bson_as_json_code (void)
{
   bson_t code = BSON_INITIALIZER;
   bson_t scope = BSON_INITIALIZER;
   char *str;

   BSON_ASSERT (bson_append_code (&code, "c", -1, "function () {}"));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (str, "{ \"c\" : { \"$code\" : \"function () {}\" } }");

   bson_free (str);
   bson_reinit (&code);

   /* empty scope */
   BSON_ASSERT (
      BSON_APPEND_CODE_WITH_SCOPE (&code, "c", "function () {}", &scope));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (
      str, "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" : { } } }");

   bson_free (str);
   bson_reinit (&code);

   BSON_APPEND_INT32 (&scope, "x", 1);
   BSON_ASSERT (
      BSON_APPEND_CODE_WITH_SCOPE (&code, "c", "function () {}", &scope));
   str = bson_as_json (&code, NULL);
   ASSERT_CMPSTR (str,
                  "{ \"c\" : { \"$code\" : \"function () {}\", \"$scope\" "
                  ": { \"x\" : 1 } } }");

   bson_free (str);
   bson_reinit (&code);

   /* test that embedded quotes are backslash-escaped */
   BSON_ASSERT (BSON_APPEND_CODE (&code, "c", "return \"a\""));
   str = bson_as_json (&code, NULL);

   /* hard to read, this is { "c" : { "$code" : "return \"a\"" } } */
   ASSERT_CMPSTR (str, "{ \"c\" : { \"$code\" : \"return \\\"a\\\"\" } }");

   bson_free (str);
   bson_destroy (&code);
   bson_destroy (&scope);
}